

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializerTest.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  XSerializerHandlers *this;
  BinMemOutputStream *pBVar6;
  MemoryManager *pMVar7;
  XMLGrammarPoolImpl *pXVar8;
  SAX2XMLReader *pSVar9;
  BinMemInputStream *this_00;
  uchar *puVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ifstream fin;
  char fURI [1000];
  undefined1 auStack_658 [8];
  BinMemOutputStream *local_650;
  char **local_648;
  int local_63c;
  char *local_638;
  BinMemInputStream *local_630;
  _func_int **local_628;
  long local_620 [4];
  byte abStack_600 [488];
  char local_418 [1000];
  
  local_648 = argV;
  if (1 < argC) {
    localeStr[0x30] = '\0';
    localeStr[0x31] = '\0';
    localeStr[0x32] = '\0';
    localeStr[0x33] = '\0';
    localeStr[0x34] = '\0';
    localeStr[0x35] = '\0';
    localeStr[0x36] = '\0';
    localeStr[0x37] = '\0';
    localeStr[0x38] = '\0';
    localeStr[0x39] = '\0';
    localeStr[0x3a] = '\0';
    localeStr[0x3b] = '\0';
    localeStr[0x3c] = '\0';
    localeStr[0x3d] = '\0';
    localeStr[0x3e] = '\0';
    localeStr[0x3f] = '\0';
    localeStr[0x20] = '\0';
    localeStr[0x21] = '\0';
    localeStr[0x22] = '\0';
    localeStr[0x23] = '\0';
    localeStr[0x24] = '\0';
    localeStr[0x25] = '\0';
    localeStr[0x26] = '\0';
    localeStr[0x27] = '\0';
    localeStr[0x28] = '\0';
    localeStr[0x29] = '\0';
    localeStr[0x2a] = '\0';
    localeStr[0x2b] = '\0';
    localeStr[0x2c] = '\0';
    localeStr[0x2d] = '\0';
    localeStr[0x2e] = '\0';
    localeStr[0x2f] = '\0';
    localeStr[0x10] = '\0';
    localeStr[0x11] = '\0';
    localeStr[0x12] = '\0';
    localeStr[0x13] = '\0';
    localeStr[0x14] = '\0';
    localeStr[0x15] = '\0';
    localeStr[0x16] = '\0';
    localeStr[0x17] = '\0';
    localeStr[0x18] = '\0';
    localeStr[0x19] = '\0';
    localeStr[0x1a] = '\0';
    localeStr[0x1b] = '\0';
    localeStr[0x1c] = '\0';
    localeStr[0x1d] = '\0';
    localeStr[0x1e] = '\0';
    localeStr[0x1f] = '\0';
    localeStr[0] = '\0';
    localeStr[1] = '\0';
    localeStr[2] = '\0';
    localeStr[3] = '\0';
    localeStr[4] = '\0';
    localeStr[5] = '\0';
    localeStr[6] = '\0';
    localeStr[7] = '\0';
    localeStr[8] = '\0';
    localeStr[9] = '\0';
    localeStr[10] = '\0';
    localeStr[0xb] = '\0';
    localeStr[0xc] = '\0';
    localeStr[0xd] = '\0';
    localeStr[0xe] = '\0';
    localeStr[0xf] = '\0';
    iVar12 = 0;
    uVar13 = 1;
    local_650 = (BinMemOutputStream *)localeStr;
    local_63c = argC;
    do {
      pcVar11 = local_648[uVar13];
      uVar14 = uVar13;
      if (*pcVar11 != '-') break;
      iVar3 = strcmp(pcVar11,"-?");
      if (iVar3 == 0) {
        usage();
        return 2;
      }
      iVar3 = strncmp(pcVar11,"-v=",3);
      if ((iVar3 == 0) || (iVar3 = strncmp(pcVar11,"-V=",3), iVar3 == 0)) {
        pcVar11 = pcVar11 + 3;
        iVar3 = strcmp(pcVar11,"never");
        if (iVar3 == 0) {
          valScheme = Val_Never;
LAB_00104fac:
          bVar1 = true;
        }
        else {
          iVar3 = strcmp(pcVar11,"auto");
          if (iVar3 == 0) {
            valScheme = Val_Auto;
            goto LAB_00104fac;
          }
          iVar3 = strcmp(pcVar11,"always");
          if (iVar3 == 0) {
            valScheme = Val_Always;
            goto LAB_00104fac;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
          sVar5 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,sVar5);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
          std::ostream::put('\b');
          std::ostream::flush();
          iVar12 = 2;
          bVar1 = false;
        }
        if (!bVar1) {
          return iVar12;
        }
      }
      else {
        iVar3 = strcmp(pcVar11,"-n");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar11,"-N"), iVar3 == 0)) {
          doNamespaces = 1;
        }
        else {
          iVar3 = strcmp(pcVar11,"-s");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar11,"-S"), iVar3 == 0)) {
            doSchema = 1;
          }
          else {
            iVar3 = strcmp(pcVar11,"-f");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar11,"-F"), iVar3 == 0)) {
              schemaFullChecking = 1;
            }
            else {
              iVar3 = strcmp(pcVar11,"-l");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar11,"-L"), iVar3 == 0)) {
                doList = '\x01';
              }
              else {
                iVar3 = strcmp(pcVar11,"-p");
                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar11,"-P"), iVar3 == 0)) {
                  namespacePrefixes = 1;
                }
                else {
                  iVar3 = strcmp(pcVar11,"-special:nel");
                  if (iVar3 == 0) {
                    recognizeNEL = '\x01';
                  }
                  else {
                    iVar3 = strncmp(pcVar11,"-locale=",8);
                    if (iVar3 == 0) {
                      strcpy(localeStr,pcVar11 + 8);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Unknown option \'",0x10);
                      poVar4 = std::operator<<((ostream *)&std::cerr,local_648[uVar13]);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar4,"\', ignoring it\n",0xf);
                      std::endl<char,std::char_traits<char>>(poVar4);
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar13 = uVar13 + 1;
      uVar14 = (ulong)(uint)argC;
    } while ((uint)argC != uVar13);
    iVar12 = local_63c;
    if ((int)uVar14 != local_63c) {
      if (localeStr[0] == '\0') {
        local_650 = (BinMemOutputStream *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale;
      }
      xercesc_4_0::XMLPlatformUtils::Initialize
                ((char *)local_650,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
      if (recognizeNEL == '\x01') {
        xercesc_4_0::XMLPlatformUtils::recognizeNEL
                  (true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      std::ifstream::ifstream(local_620);
      if (doList == '\x01') {
        std::ifstream::open((char *)local_620,(_Ios_Openmode)local_648[uVar14 & 0xffffffff]);
      }
      if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 5) == 0) {
        local_628 = (_func_int **)std::operator<<;
        do {
          uVar13 = 0;
          memset(local_418,0,1000);
          if (doList == '\x01') {
            bVar1 = true;
            if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 2) == 0) {
              std::ios::widen((char)auStack_658 + (char)*(long *)(local_620[0] + -0x18) + '8');
              std::istream::getline((char *)local_620,(long)local_418,-0x18);
              if (local_418[0] != '\0') {
                xmlFile = local_418;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"==Parsing== ",0xc);
                pcVar11 = xmlFile;
                if (xmlFile == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b208);
                }
                else {
                  sVar5 = strlen(xmlFile);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar11,sVar5);
                }
                cVar2 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
                uVar13 = (ulong)(uint)(int)cVar2;
                std::ostream::put('\b');
                std::ostream::flush();
                goto LAB_00105237;
              }
              bVar1 = false;
            }
          }
          else {
            bVar1 = true;
            iVar3 = (int)uVar14;
            if (iVar3 < iVar12) {
              xmlFile = local_648[iVar3];
              uVar14 = (ulong)(iVar3 + 1);
LAB_00105237:
              pcVar11 = xmlFile;
              if (handler == (XSerializerHandlers *)0x0) {
                this = (XSerializerHandlers *)operator_new(0x58);
                XSerializerHandlers::XSerializerHandlers(this);
                handler = this;
              }
              pBVar6 = (BinMemOutputStream *)
                       xercesc_4_0::XMemory::operator_new((XMemory *)0x28,uVar13);
              uVar13 = 0x400;
              xercesc_4_0::BinMemOutputStream::BinMemOutputStream
                        (pBVar6,0x400,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              local_650 = pBVar6;
              pMVar7 = (MemoryManager *)operator_new(8);
              pMVar7->_vptr_MemoryManager = local_628;
              pXVar8 = (XMLGrammarPoolImpl *)
                       xercesc_4_0::XMemory::operator_new((XMemory *)0x40,uVar13);
              xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(pXVar8,pMVar7);
              pSVar9 = getParser((XMLGrammarPool *)pXVar8,false);
              (*pSVar9->_vptr_SAX2XMLReader[0xc])
                        (pSVar9,&xercesc_4_0::XMLUni::fgXercesCacheGrammarFromParse,1);
              (*pSVar9->_vptr_SAX2XMLReader[0x10])(pSVar9,pcVar11);
              local_638 = pcVar11;
              pBVar6 = local_650;
              (**(code **)(*(long *)pXVar8 + 0x78))(pXVar8);
              (*pSVar9->_vptr_SAX2XMLReader[1])(pSVar9);
              (**(code **)(*(long *)pXVar8 + 8))(pXVar8);
              (*pMVar7->_vptr_MemoryManager[1])(pMVar7);
              this_00 = (BinMemInputStream *)
                        xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)pBVar6);
              puVar10 = (uchar *)xercesc_4_0::BinMemOutputStream::getRawBuffer();
              uVar13 = xercesc_4_0::BinMemOutputStream::getSize();
              xercesc_4_0::BinMemInputStream::BinMemInputStream
                        (this_00,puVar10,uVar13,BufOpt_Reference,
                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
              local_630 = this_00;
              pMVar7 = (MemoryManager *)operator_new(8);
              pMVar7->_vptr_MemoryManager = local_628;
              pXVar8 = (XMLGrammarPoolImpl *)
                       xercesc_4_0::XMemory::operator_new((XMemory *)0x40,(ulong)puVar10);
              xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl(pXVar8,pMVar7);
              (**(code **)(*(long *)pXVar8 + 0x80))(pXVar8,local_630);
              pSVar9 = getParser((XMLGrammarPool *)pXVar8,true);
              (*pSVar9->_vptr_SAX2XMLReader[0xc])
                        (pSVar9,&xercesc_4_0::XMLUni::fgXercesUseCachedGrammarInParse,1);
              (*(handler->super_DefaultHandler).super_EntityResolver._vptr_EntityResolver[0x12])();
              xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
              (*pSVar9->_vptr_SAX2XMLReader[0x10])(pSVar9);
              xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
              pcVar11 = local_638;
              if (handler->fSawErrors == false) {
                if (local_638 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b0c0);
                }
                else {
                  sVar5 = strlen(local_638);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar11,sVar5);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms (",5);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," elems, ",8);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," attrs, ",8);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," spaces, ",9);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," chars)",7);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
              }
              else {
                errorOccurred = 1;
              }
              (*pSVar9->_vptr_SAX2XMLReader[1])(pSVar9);
              (**(code **)(*(long *)pXVar8 + 8))(pXVar8);
              (*pMVar7->_vptr_MemoryManager[1])(pMVar7);
              (**(code **)(*(long *)local_630 + 8))();
              (**(code **)(*(long *)local_650 + 8))();
              bVar1 = false;
              iVar12 = local_63c;
            }
          }
        } while (!bVar1);
        if (doList == '\x01') {
          std::ifstream::close();
        }
        xercesc_4_0::XMLPlatformUtils::Terminate();
        iVar12 = (uint)errorOccurred << 2;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Cannot open the list file: ",0x1b);
        pcVar11 = local_648[uVar14 & 0xffffffff];
        if (pcVar11 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10b208);
        }
        else {
          sVar5 = strlen(pcVar11);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
        std::ostream::put('\b');
        iVar12 = 2;
        std::ostream::flush();
      }
      std::ifstream::~ifstream(local_620);
      return iVar12;
    }
  }
  usage();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAX2XMLReader::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAX2XMLReader::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAX2XMLReader::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = false;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = false;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-p")
              ||  !strcmp(argV[argInd], "-P"))
        {
            namespacePrefixes = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }

    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        parseCase(xmlFile);
    }

    if (doList)
        fin.close();

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}